

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

Am_Object_Demon * __thiscall
Am_Demon_Set::Get_Object_Demon(Am_Demon_Set *this,Am_Object_Demon_Type type)

{
  if (type < (Am_DESTROY_OBJ|Am_COPY_OBJ)) {
    return *(Am_Object_Demon **)((long)(this->data->change_demons + -3) + (ulong)type * 8);
  }
  return (Am_Object_Demon *)0x0;
}

Assistant:

Am_Object_Demon *
Am_Demon_Set::Get_Object_Demon(Am_Object_Demon_Type type) const
{
  switch (type) {
  case Am_CREATE_OBJ:
    return data->create_demon;
  case Am_COPY_OBJ:
    return data->copy_demon;
  case Am_DESTROY_OBJ:
    return data->destroy_demon;
  }
  return nullptr;
}